

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

tuple<int,_int,_int> __thiscall
Display::getMaximumFieldsize(Display *this,int window_width,int window_height,int mine_count)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  runtime_error *this_00;
  long *plVar7;
  int iVar8;
  size_type *psVar9;
  _Head_base<0UL,_int,_false> _Var10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar12;
  tuple<int,_int,_int> tVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined8 uVar11;
  
  iVar2 = getMaxTextWidth(mine_count);
  if (iVar2 < 2) {
    iVar2 = 1;
  }
  if ((window_height < 4) || (window_width <= iVar2)) {
    iVar6 = getMaxTextWidth(mine_count);
    iVar2 = 1;
    if (1 < iVar6) {
      iVar2 = iVar6;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_130,window_width);
    std::operator+(&local_b0,"Can\'t display any minefield on this size (",&local_130);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_190._M_dataplus._M_p = (pointer)*plVar7;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_190._M_dataplus._M_p == psVar9) {
      local_190.field_2._M_allocated_capacity = *psVar9;
      local_190.field_2._8_8_ = plVar7[3];
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *psVar9;
    }
    local_190._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::to_string(&local_d0,window_height);
    std::operator+(&local_90,&local_190,&local_d0);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_170._M_dataplus._M_p = (pointer)*plVar7;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_170._M_dataplus._M_p == psVar9) {
      local_170.field_2._M_allocated_capacity = *psVar9;
      local_170.field_2._8_8_ = plVar7[3];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar9;
    }
    local_170._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::to_string(&local_f0,iVar2 + 1);
    std::operator+(&local_70,&local_170,&local_f0);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_150._M_dataplus._M_p = (pointer)*plVar7;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_150._M_dataplus._M_p == psVar9) {
      local_150.field_2._M_allocated_capacity = *psVar9;
      local_150.field_2._8_8_ = plVar7[3];
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar9;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::to_string(&local_110,4);
    std::operator+(&local_50,&local_150,&local_110);
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = 2;
  do {
    iVar6 = iVar2;
    uVar3 = getMaxTextWidth(mine_count);
    if ((int)uVar3 < 2) {
      uVar3 = 1;
    }
    iVar2 = iVar6 + 1;
  } while ((iVar6 + 2 <= window_height) && (uVar3 < (uint)window_width));
  iVar5 = 1;
  do {
    iVar4 = iVar5;
    iVar12 = iVar4 * 2 + -1;
    iVar5 = getMaxTextWidth(mine_count);
    if (iVar12 < iVar5) {
      iVar12 = iVar5;
    }
  } while ((iVar2 <= window_height) && (iVar5 = iVar4 + 1, iVar12 < window_width));
  iVar12 = iVar4 * 2 + -3;
  iVar5 = getMaxTextWidth(mine_count);
  _Var10._M_head_impl = (int)extraout_RDX;
  if (iVar5 <= iVar12) {
    iVar5 = iVar12;
  }
  iVar8 = (iVar4 + -1) * (iVar6 + -2);
  if ((iVar2 <= window_height) && (iVar5 < window_width)) {
    iVar2 = 1;
    uVar11 = extraout_RDX;
    do {
      _Var10._M_head_impl = (int)uVar11;
      if ((iVar8 < mine_count) || (8 < iVar2 - 1U)) break;
      dVar1 = pow(10.0,(double)iVar2);
      mine_count = (int)dVar1;
      iVar5 = getMaxTextWidth(mine_count);
      _Var10._M_head_impl = (int)extraout_RDX_00;
      if (iVar5 <= iVar12) {
        iVar5 = iVar12;
      }
      iVar2 = iVar2 + 1;
      uVar11 = extraout_RDX_00;
    } while (iVar5 < window_width);
  }
  iVar2 = mine_count + -1;
  if (iVar8 <= mine_count + -1) {
    iVar2 = iVar8;
  }
  *(int *)&(this->controller).mfield.mines.
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start = iVar2;
  *(int *)((long)&(this->controller).mfield.mines.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4) = iVar6 + -2;
  *(int *)&(this->controller).mfield.mines.
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = iVar4 + -1;
  tVar13.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       _Var10._M_head_impl;
  tVar13.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int,_int,_int>)tVar13.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> Display::getMaximumFieldsize(int window_width, int window_height, int mine_count) {
    int width = 1;
    int height = 1;
    int count = mine_count;

    if (! isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        int required_width, required_height;
        std::tie(required_width, required_height) = Display::getRequiredWindowSize(width, height, count);
        throw std::runtime_error("Can't display any minefield on this size (" + std::to_string(window_width) + "x" + std::to_string(window_height) + "), minimum required: " + std::to_string(required_width) + "x" + std::to_string(required_height));
    }

    // get max y
    while (isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        height++;
    }
    // height is now one too much
    height--;

    // get max x
    while (isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        width++;
    }
    // width is now one too much
    width--;

    // now get max. minecount
    
    int exponent = 0;
    while (isWindowSizeSufficient(width, height, count, window_width, window_height) && count <= width * height) {
        exponent++;
        if (std::numeric_limits<int>::digits10 < exponent) {
            break;
        }
        count = std::pow(10, exponent);
    }
    // remove one decimal digit -> is OK
    count--;
    if (count > width * height) {
        count = width * height;
    }

    return std::make_tuple(width, height, count);
}